

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O1

bilingual_str *
common::TransactionErrorString(bilingual_str *__return_storage_ptr__,TransactionError err)

{
  long *plVar1;
  long *plVar2;
  long in_FS_OFFSET;
  long *local_128;
  long local_120;
  long local_118 [2];
  long *local_108;
  long local_100;
  long local_f8 [2];
  long *local_e8;
  long local_e0;
  long local_d8 [2];
  long *local_c8;
  long local_c0;
  long local_b8 [2];
  long *local_a8;
  long local_a0;
  long local_98 [2];
  long *local_88;
  long local_80;
  long local_78 [2];
  long *local_68;
  long local_60;
  long local_58 [2];
  long *local_48;
  long local_40;
  long local_38 [2];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  switch(err) {
  case OK:
    plVar2 = local_38;
    local_48 = plVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"No error","");
    (__return_storage_ptr__->original)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->original).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_48,local_40 + (long)local_48);
    (__return_storage_ptr__->translated)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->translated).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->translated,local_48,local_40 + (long)local_48);
    plVar1 = local_48;
    break;
  case MISSING_INPUTS:
    plVar2 = local_58;
    local_68 = plVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Inputs missing or spent","");
    (__return_storage_ptr__->original)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->original).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_68,local_60 + (long)local_68);
    (__return_storage_ptr__->translated)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->translated).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->translated,local_68,local_60 + (long)local_68);
    plVar1 = local_68;
    break;
  case ALREADY_IN_UTXO_SET:
    plVar2 = local_78;
    local_88 = plVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"Transaction outputs already in utxo set","");
    (__return_storage_ptr__->original)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->original).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_88,local_80 + (long)local_88);
    (__return_storage_ptr__->translated)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->translated).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->translated,local_88,local_80 + (long)local_88);
    plVar1 = local_88;
    break;
  case MEMPOOL_REJECTED:
    plVar2 = local_98;
    local_a8 = plVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,"Transaction rejected by mempool","");
    (__return_storage_ptr__->original)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->original).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_a8,local_a0 + (long)local_a8);
    (__return_storage_ptr__->translated)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->translated).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->translated,local_a8,local_a0 + (long)local_a8);
    plVar1 = local_a8;
    break;
  case MEMPOOL_ERROR:
    plVar2 = local_b8;
    local_c8 = plVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Mempool internal error","")
    ;
    (__return_storage_ptr__->original)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->original).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_c8,local_c0 + (long)local_c8);
    (__return_storage_ptr__->translated)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->translated).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->translated,local_c8,local_c0 + (long)local_c8);
    plVar1 = local_c8;
    break;
  case MAX_FEE_EXCEEDED:
    plVar2 = local_d8;
    local_e8 = plVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,
               "Fee exceeds maximum configured by user (e.g. -maxtxfee, maxfeerate)","");
    (__return_storage_ptr__->original)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->original).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_e8,local_e0 + (long)local_e8);
    (__return_storage_ptr__->translated)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->translated).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->translated,local_e8,local_e0 + (long)local_e8);
    plVar1 = local_e8;
    break;
  case MAX_BURN_EXCEEDED:
    plVar2 = local_f8;
    local_108 = plVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,
               "Unspendable output exceeds maximum configured by user (maxburnamount)","");
    (__return_storage_ptr__->original)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->original).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_108,local_100 + (long)local_108);
    (__return_storage_ptr__->translated)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->translated).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->translated,local_108,local_100 + (long)local_108);
    plVar1 = local_108;
    break;
  case INVALID_PACKAGE:
    plVar2 = local_118;
    local_128 = plVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_128,"Transaction rejected due to invalid package","");
    (__return_storage_ptr__->original)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->original).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_128,local_120 + (long)local_128);
    (__return_storage_ptr__->translated)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->translated).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->translated,local_128,local_120 + (long)local_128);
    plVar1 = local_128;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/messages.cpp"
                  ,0x91,"bilingual_str common::TransactionErrorString(const TransactionError)");
  }
  if (plVar1 != plVar2) {
    operator_delete(plVar1,*plVar2 + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

bilingual_str TransactionErrorString(const TransactionError err)
{
    switch (err) {
        case TransactionError::OK:
            return Untranslated("No error");
        case TransactionError::MISSING_INPUTS:
            return Untranslated("Inputs missing or spent");
        case TransactionError::ALREADY_IN_UTXO_SET:
            return Untranslated("Transaction outputs already in utxo set");
        case TransactionError::MEMPOOL_REJECTED:
            return Untranslated("Transaction rejected by mempool");
        case TransactionError::MEMPOOL_ERROR:
            return Untranslated("Mempool internal error");
        case TransactionError::MAX_FEE_EXCEEDED:
            return Untranslated("Fee exceeds maximum configured by user (e.g. -maxtxfee, maxfeerate)");
        case TransactionError::MAX_BURN_EXCEEDED:
            return Untranslated("Unspendable output exceeds maximum configured by user (maxburnamount)");
        case TransactionError::INVALID_PACKAGE:
            return Untranslated("Transaction rejected due to invalid package");
        // no default case, so the compiler can warn about missing cases
    }
    assert(false);
}